

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

completion * __thiscall
mjs::interpreter::impl::operator()(completion *__return_storage_ptr__,impl *this,try_statement *s)

{
  statement *psVar1;
  completion_type cVar2;
  wchar_t *pwVar3;
  long *plVar4;
  value *rhs;
  completion *pcVar5;
  object_ptr o;
  auto_scope catch_scope;
  completion fc;
  completion c;
  undefined1 auStack_d8 [16];
  auto_scope local_c8;
  completion local_b0;
  completion local_70;
  
  eval(&local_70,this,
       (s->block_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
       _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
       super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl);
  if ((local_70.type == throw_) &&
     (psVar1 = (s->catch_)._M_t.
               super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
               super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
               super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl,
     psVar1 != (statement *)0x0)) {
    gc_heap_ptr_untyped::get(&(this->global_).super_gc_heap_ptr_untyped);
    global_object::make_object((global_object *)auStack_d8);
    plVar4 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)auStack_d8);
    local_c8.old_scopes.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)(s->catch_id_)._M_dataplus._M_p
    ;
    local_c8.parent = (impl *)(s->catch_id_)._M_string_length;
    string::string((string *)&local_b0,this->heap_,(wstring_view *)&local_c8);
    (**(code **)(*plVar4 + 8))(plVar4,&local_b0,&local_70.result,4);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_b0);
    auto_scope::auto_scope(&local_c8,this,(object_ptr *)auStack_d8,&this->active_scope_);
    eval(&local_b0,this,psVar1);
    local_70.type = local_b0.type;
    value::operator=(&local_70.result,&local_b0.result);
    local_70.target._M_len = local_b0.target._M_len;
    local_70.target._M_str = local_b0.target._M_str;
    value::destroy(&local_b0.result);
    auto_scope::~auto_scope(&local_c8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_d8);
  }
  psVar1 = (s->finally_)._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  if (psVar1 == (statement *)0x0) {
    __return_storage_ptr__->type = local_70.type;
    value::value(&__return_storage_ptr__->result,&local_70.result);
    (__return_storage_ptr__->target)._M_len = local_70.target._M_len;
    (__return_storage_ptr__->target)._M_str = local_70.target._M_str;
  }
  else {
    eval(&local_b0,this,psVar1);
    cVar2 = local_70.type;
    if (local_b0.type != normal) {
      cVar2 = local_b0.type;
    }
    __return_storage_ptr__->type = cVar2;
    rhs = &local_70.result;
    if (local_b0.type != normal) {
      rhs = &local_b0.result;
    }
    value::value(&__return_storage_ptr__->result,rhs);
    pcVar5 = &local_b0;
    if (local_b0.type == normal) {
      pcVar5 = &local_70;
    }
    pwVar3 = (pcVar5->target)._M_str;
    (__return_storage_ptr__->target)._M_len = (pcVar5->target)._M_len;
    (__return_storage_ptr__->target)._M_str = pwVar3;
    value::destroy(&local_b0.result);
  }
  value::destroy(&local_70.result);
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const try_statement& s) {
        auto c = eval(s.block());
        if (c.type != completion_type::throw_) {
            // Nothing to do
        } else if (auto catch_ = s.catch_block()) {
            auto o = global_->make_object();
            o->put(string{heap_, s.catch_id()}, c.result, property_attribute::dont_delete);
            auto_scope catch_scope{*this, o, active_scope_};
            c = eval(*catch_);
        }
        if (auto finally_ = s.finally_block()) {
            auto fc = eval(*finally_);
            return fc ? fc : c;
        }
        return c;
    }